

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gest_matrix.cpp
# Opt level: O3

void ScalarTimesMatrix(double s,Matrix m,Matrix product)

{
  double *pdVar1;
  double *pdVar2;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  ulong uVar6;
  
  bVar5 = *(byte *)((long)m + -7);
  if ((bVar5 == *(byte *)((long)product + -7)) &&
     (uVar4 = (ulong)*(byte *)((long)m + -6),
     *(byte *)((long)m + -6) == *(byte *)((long)product + -6))) {
    if (bVar5 != 0) {
      uVar3 = 0;
      do {
        if ((char)uVar4 == '\0') {
          uVar4 = 0;
        }
        else {
          pdVar1 = m[uVar3];
          pdVar2 = product[uVar3];
          uVar6 = 0;
          do {
            pdVar2[uVar6] = pdVar1[uVar6] * s;
            uVar6 = uVar6 + 1;
            uVar4 = (ulong)*(byte *)((long)m + -6);
          } while (uVar6 < uVar4);
          bVar5 = *(byte *)((long)m + -7);
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < bVar5);
    }
    return;
  }
  Am_Error("ScalarTimesMatrix");
}

Assistant:

void
ScalarTimesMatrix(double s, Matrix m, Matrix product)
{
  int i, j;

  if (NROWS(m) != NROWS(product) || NCOLS(m) != NCOLS(product))
    Am_Error("ScalarTimesMatrix"); //: result wrong size (%d!=%d)or(%d!=%d)",
  //NROWS(m), NROWS(product),
  //NCOLS(m), NCOLS(product));

  for (i = 0; i < NROWS(m); i++)
    for (j = 0; j < NCOLS(m); j++)
      product[i][j] = s * m[i][j];
}